

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum.hpp
# Opt level: O1

void __thiscall
ranges::
partial_sum_view<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>,_std::plus<void>_>
::cursor<false>::cursor(cursor<false> *this,Parent *rng)

{
  semiregular_box_t<range_value_t<concat_view<single_view<int>,_ref_view<array<int,_12UL>_>_>_>_>
  *psVar1;
  size_t in_RCX;
  void *__buf;
  concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_> *this_00;
  
  this->parent_ = rng;
  this_00 = &rng->base_;
  view_facade<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>,_(ranges::cardinality)13>
  ::begin<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>_>
            (&this->current_,
             (view_facade<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>,_(ranges::cardinality)13>
              *)this_00);
  if ((*(size_t *)
        ((long)&(this->current_).
                super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                .
                super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
                .
                super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
                .
                super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                .value.its_ + 8) != 1) ||
     ((this->current_).
      super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
      .
      super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void>
      .
      super_mixin_base_t<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>_>
      .
      super_box<ranges::concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
      .value.its_.super_variant_data<int_*,_int_*>.field_0 !=
      (anon_union_8_2_3194c211_for_type_0)
      ((rng->base_).rngs_.
       super__Tuple_impl<0UL,_ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>.
       super__Tuple_impl<1UL,_ranges::ref_view<std::array<int,_12UL>_>_>.
       super__Head_base<1UL,_ranges::ref_view<std::array<int,_12UL>_>,_false>._M_head_impl.rng_ + 1)
     )) {
    psVar1 = (semiregular_box_t<range_value_t<concat_view<single_view<int>,_ref_view<array<int,_12UL>_>_>_>_>
              *)concat_view<ranges::single_view<int>,_ranges::ref_view<std::array<int,_12UL>_>_>::
                cursor<false>::read((cursor<false> *)&this->current_,(int)this_00,__buf,in_RCX);
    this->sum_ = *psVar1;
  }
  return;
}

Assistant:

constexpr explicit cursor(Parent * rng)
              : parent_{rng}
              , current_(ranges::begin(rng->base_))
            {
                if(current_ != ranges::end(rng->base_))
                    sum_ = *current_;
            }